

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_getshortstr_continue(TString *key,Node *n)

{
  Node *pNVar1;
  byte bVar2;
  TString *pTVar3;
  bool bVar4;
  TValue *in_RAX;
  char *__assertion;
  long lVar5;
  
  do {
    lVar5 = (long)(n->i_key).nk.next;
    if (lVar5 == 0) {
      bVar4 = false;
      in_RAX = &luaO_nilobject_;
    }
    else {
      pNVar1 = n + lVar5;
      if (n[lVar5].i_key.nk.tt_ == 0x8004) {
        pTVar3 = (TString *)(pNVar1->i_key).nk.value_.gc;
        bVar2 = pTVar3->tt;
        if ((bVar2 & 0xf) != 4) {
          __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_00122b38:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
        }
        if (bVar2 != 4) {
          __assertion = 
          "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
          ;
          goto LAB_00122b38;
        }
        if (pTVar3 == key) {
          bVar4 = false;
          in_RAX = &pNVar1->i_val;
          n = pNVar1;
          goto LAB_00122b1e;
        }
      }
      bVar4 = true;
      n = pNVar1;
    }
LAB_00122b1e:
    if (!bVar4) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

const TValue *luaH_getshortstr_continue(TString *key, Node *n) {
  for (;;) { /* check whether 'key' is somewhere in the chain starting from next node after n */
    int nx = gnext(n);
    if (nx == 0)
      return luaO_nilobject; /* not found */
    n += nx;
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n); /* that's it */
  }
}